

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

iteration_time __thiscall
helics::CommonCore::requestTimeIterative
          (CommonCore *this,LocalFederateId federateID,Time next,IterationRequest iterate)

{
  FederateStates FVar1;
  int32_t iVar2;
  FederateState *this_00;
  Time TVar3;
  InvalidFunctionCall *this_01;
  pointer_____offset_0x10___ *ppuVar4;
  ulong uVar5;
  string_view message;
  string_view message_00;
  iteration_time iVar6;
  ActionMessage treq;
  ActionMessage local_e0;
  
  this_00 = getFederateAt(this,federateID);
  if (this_00 == (FederateState *)0x0) {
    this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    message._M_str = "federateID not valid timeRequestIterative";
    message._M_len = 0x29;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)this_01,message);
    ppuVar4 = &InvalidIdentifier::typeinfo;
  }
  else {
    if (this_00->mCallbackBased != true) {
      FVar1 = FederateState::getState(this_00);
      if ((FVar1 < (UNKNOWN|INITIALIZING)) && ((0x7bU >> (FVar1 & 0x1f) & 1) != 0)) {
        TVar3.internalTimeCode = *(baseType *)(&DAT_003df128 + (ulong)FVar1 * 8);
        uVar5 = 0x7030703070707 >> ((FVar1 & (UNKNOWN|INITIALIZING)) << 3);
      }
      else {
        if (iterate == ITERATE_IF_NEEDED) {
          iVar2 = FederateState::getCurrentIteration(this_00);
          iterate = (iVar2 < (this->super_BrokerBase).maxIterationCount) * '\x02';
        }
        if ((ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED) < 5) {
          ActionMessage::ActionMessage(&local_e0,cmd_stop);
          local_e0.dest_id.gid = (this_00->global_id)._M_i.gid;
          local_e0.source_id.gid = (this_00->global_id)._M_i.gid;
          FederateState::addAction(this_00,&local_e0);
          ActionMessage::~ActionMessage(&local_e0);
        }
        ActionMessage::ActionMessage(&local_e0,cmd_time_request);
        local_e0.source_id.gid = (this_00->global_id)._M_i.gid;
        local_e0.dest_id.gid = (this_00->global_id)._M_i.gid;
        local_e0.actionTime.internalTimeCode = next.internalTimeCode;
        setIterationFlags(&local_e0,iterate);
        local_e0.flags._0_1_ = (byte)local_e0.flags | 0x20;
        BrokerBase::addActionMessage(&this->super_BrokerBase,&local_e0);
        iVar6 = FederateState::requestTime(this_00,next,iterate,false);
        TVar3 = iVar6.grantedTime.internalTimeCode;
        uVar5 = (ulong)iVar6._8_4_;
        ActionMessage::~ActionMessage(&local_e0);
      }
      iVar6._8_8_ = uVar5 & 0xffffffff;
      iVar6.grantedTime.internalTimeCode = TVar3.internalTimeCode;
      return iVar6;
    }
    this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    message_00._M_str =
         "Time request iterative operation is not permitted for callback based federates";
    message_00._M_len = 0x4e;
    InvalidFunctionCall::InvalidFunctionCall(this_01,message_00);
    ppuVar4 = &InvalidFunctionCall::typeinfo;
  }
  __cxa_throw(this_01,ppuVar4,HelicsException::~HelicsException);
}

Assistant:

iteration_time CommonCore::requestTimeIterative(LocalFederateId federateID,
                                                Time next,
                                                IterationRequest iterate)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid timeRequestIterative"));
    }
    if (fed->isCallbackFederate()) {
        throw(InvalidFunctionCall(
            "Time request iterative operation is not permitted for callback based federates"));
    }
    switch (fed->getState()) {
        case FederateStates::EXECUTING:
            break;
        case FederateStates::FINISHED:
        case FederateStates::TERMINATING:
            return iteration_time{Time::maxVal(), IterationResult::HALTED};
        case FederateStates::CREATED:
        case FederateStates::INITIALIZING:
            return iteration_time{timeZero, IterationResult::ERROR_RESULT};
        case FederateStates::UNKNOWN:
        case FederateStates::ERRORED:
            return iteration_time{Time::maxVal(), IterationResult::ERROR_RESULT};
    }

    // limit the iterations
    if (iterate == IterationRequest::ITERATE_IF_NEEDED) {
        if (fed->getCurrentIteration() >= maxIterationCount) {
            iterate = IterationRequest::NO_ITERATIONS;
        }
    }

    auto cBrokerState = getBrokerState();
    switch (cBrokerState) {
        case BrokerState::TERMINATING:
        case BrokerState::TERMINATED:
        case BrokerState::CONNECTED_ERROR:
        case BrokerState::TERMINATING_ERROR:
        case BrokerState::ERRORED: {
            ActionMessage terminate(CMD_STOP);
            terminate.dest_id = fed->global_id;
            terminate.source_id = fed->global_id;
            fed->addAction(terminate);
        } break;
        default:
            break;
    }
    // generate the request through the core
    ActionMessage treq(CMD_TIME_REQUEST);
    treq.source_id = fed->global_id.load();
    treq.dest_id = fed->global_id.load();
    treq.actionTime = next;
    setIterationFlags(treq, iterate);
    setActionFlag(treq, indicator_flag);
    addActionMessage(treq);

    return fed->requestTime(next, iterate, false);
}